

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpExtraHeaders.c
# Opt level: O1

int UpnpExtraHeaders_set_resp(UpnpExtraHeaders *p,char *s)

{
  char *pcVar1;
  
  pcVar1 = ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_resp);
    p->m_resp = pcVar1;
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

int UpnpExtraHeaders_set_resp(UpnpExtraHeaders *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_resp);
	p->m_resp = q;

	return 1;
}